

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,false>
               (float *ldata,float *rdata,bool *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  bool bVar3;
  unsigned_long uVar4;
  ValidityMask *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  float rentry_2;
  float lentry_2;
  idx_t i;
  float rentry_1;
  float lentry_1;
  idx_t start;
  float rentry;
  float lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ValidityMask *in_stack_ffffffffffffff80;
  ValidityMask *mask_00;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  idx_t in_stack_ffffffffffffff90;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  ValidityMask *local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RCX * 4),in_RDX,
             (void *)((long)in_RDX + (long)in_RCX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + (long)local_20 * 4),local_18,
             (void *)((long)local_18 + (long)local_20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar3) {
    for (mask_00 = (ValidityMask *)0x0; mask_00 < local_20;
        mask_00 = (ValidityMask *)
                  ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      bVar3 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::NotEquals,float,float,bool>
                        (SUB81(in_stack_ffffffffffffff90 >> 0x38,0),(float)in_stack_ffffffffffffff90
                         ,in_stack_ffffffffffffff8c,mask_00,
                         CONCAT44(*(undefined4 *)((long)local_8 + (long)mask_00 * 4),
                                  *(undefined4 *)((long)local_10 + (long)mask_00 * 4)));
      *(bool *)((long)local_18 + (long)mask_00) = bVar3;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x50aa45);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (idx_t)in_stack_ffffffffffffff80);
      uVar4 = MinValue<unsigned_long>(local_38 + 0x40,(unsigned_long)local_20);
      bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar3) {
        for (; uVar2 = local_38, local_38 < uVar4; local_38 = local_38 + 1) {
          bVar3 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::NotEquals,float,float,bool>
                            (SUB81(in_stack_ffffffffffffff90 >> 0x38,0),
                             (float)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                             in_stack_ffffffffffffff80,
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          *(bool *)((long)local_18 + local_38) = bVar3;
        }
      }
      else {
        bVar3 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        uVar1 = local_38;
        uVar2 = uVar4;
        if (!bVar3) {
          for (; uVar2 = local_38, local_38 < uVar4; local_38 = local_38 + 1) {
            in_stack_ffffffffffffff90 = local_38 - uVar1;
            bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_50,(idx_t *)&stack0xffffffffffffff90);
            if (bVar3) {
              in_stack_ffffffffffffff8c = *(float *)((long)local_8 + local_38 * 4);
              in_stack_ffffffffffffff88 = *(undefined4 *)((long)local_10 + local_38 * 4);
              bVar3 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::NotEquals,float,float,bool>
                                (SUB81(in_stack_ffffffffffffff90 >> 0x38,0),
                                 (float)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                                 in_stack_ffffffffffffff80,
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
              *(bool *)((long)local_18 + local_38) = bVar3;
            }
          }
        }
      }
      local_38 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}